

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O0

void __thiscall SCCLiveness::ProcessRegDef(SCCLiveness *this,RegOpnd *regDef,Instr *instr)

{
  uint uVar1;
  StackSym *this_00;
  anon_union_8_3_6c1fdb8e_for_scratch aVar2;
  code *pcVar3;
  RegNum RVar4;
  bool bVar5;
  IRType IVar6;
  uint32 uVar7;
  uint newUseValue;
  Opnd *this_01;
  RegOpnd *pRVar8;
  undefined4 *puVar9;
  bool local_51;
  Lifetime *local_40;
  Lifetime *lifetime;
  StackSym *srcSym;
  Opnd *src;
  StackSym *stackSym;
  Instr *instr_local;
  RegOpnd *regDef_local;
  SCCLiveness *this_local;
  
  this_00 = regDef->m_sym;
  if ((this_00 == (StackSym *)0x0) || (RVar4 = IR::RegOpnd::GetReg(regDef), RVar4 != RegNOREG)) {
    this_01 = IR::Instr::GetSrc1(instr);
    bVar5 = LowererMD::IsAssign(instr);
    if ((bVar5) &&
       ((bVar5 = IR::Opnd::IsRegOpnd(this_01), bVar5 &&
        (pRVar8 = IR::Opnd::AsRegOpnd(this_01), pRVar8->m_sym != (StackSym *)0x0)))) {
      pRVar8 = IR::Opnd::AsRegOpnd(this_01);
      aVar2 = pRVar8->m_sym->scratch;
      RVar4 = IR::RegOpnd::GetReg(regDef);
      BVUnitT<unsigned_long>::Set((BVUnitT<unsigned_long> *)((long)aVar2 + 0x70),(uint)RVar4);
    }
    if (this_00 == (StackSym *)0x0) {
      return;
    }
  }
  bVar5 = StackSym::IsArgSlotSym(this_00);
  if (!bVar5) {
    local_40 = *(Lifetime **)&(this_00->scratch).globOpt;
    if (local_40 == (Lifetime *)0x0) {
      RVar4 = IR::RegOpnd::GetReg(regDef);
      local_40 = InsertLifetime(this,this_00,RVar4,instr);
      local_40->region = this->curRegion;
      bVar5 = IR::Opnd::IsFloat(&regDef->super_Opnd);
      local_51 = true;
      if (!bVar5) {
        local_51 = IR::Opnd::IsSimd128(&regDef->super_Opnd);
      }
      *(ushort *)&local_40->field_0x9c =
           *(ushort *)&local_40->field_0x9c & 0xdfff | (ushort)local_51 << 0xd;
    }
    else {
      uVar1 = local_40->start;
      uVar7 = IR::Instr::GetNumber(instr);
      if (uVar7 < uVar1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                           ,0x294,"(lifetime->start <= instr->GetNumber())",
                           "Lifetime start not set correctly");
        if (!bVar5) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      ExtendLifetime(this,local_40,instr);
      if ((local_40->region != this->curRegion) && (bVar5 = Func::DoOptimizeTry(this->func), !bVar5)
         ) {
        *(ushort *)&local_40->field_0x9c = *(ushort *)&local_40->field_0x9c & 0xfeff | 0x100;
      }
    }
    newUseValue = LinearScan::GetUseSpillCost
                            ((uint)this->loopNest,
                             (uint)(this->lastOpHelperLabel != (LabelInstr *)0x0));
    Lifetime::AddToUseCount(local_40,newUseValue,this->curLoop,this->func);
    IVar6 = IR::Opnd::GetType(&regDef->super_Opnd);
    BVUnitT<unsigned_long>::Set(&local_40->intUsageBv,TySize[IVar6]);
  }
  return;
}

Assistant:

void
SCCLiveness::ProcessRegDef(IR::RegOpnd *regDef, IR::Instr *instr)
{
    StackSym * stackSym = regDef->m_sym;

    // PhysReg
    if (stackSym == nullptr || regDef->GetReg() != RegNOREG)
    {
        IR::Opnd *src = instr->GetSrc1();

        // If this symbol is assigned to a physical register, let's tell the register
        // allocator to prefer assigning that register to the lifetime.
        //
        // Note: this only pays off if this is the last-use of the symbol, but
        // unfortunately we don't have a way to tell that currently...
        if (LowererMD::IsAssign(instr) && src->IsRegOpnd() && src->AsRegOpnd()->m_sym)
        {
            StackSym *srcSym = src->AsRegOpnd()->m_sym;

            srcSym->scratch.linearScan.lifetime->regPreference.Set(regDef->GetReg());
        }

        // This physreg doesn't have a lifetime, just return.
        if (stackSym == nullptr)
        {
            return;
        }
    }

    // Arg slot sym can be in a RegOpnd for param passed via registers
    // Skip creating a lifetime for those.
    if (stackSym->IsArgSlotSym())
    {
        return;
    }

    // We'll extend the lifetime only if there are uses in a different loop region
    // from one of the defs.

    Lifetime * lifetime = stackSym->scratch.linearScan.lifetime;

    if (lifetime == nullptr)
    {
        lifetime = this->InsertLifetime(stackSym, regDef->GetReg(), instr);
        lifetime->region = this->curRegion;
        lifetime->isFloat = regDef->IsFloat() || regDef->IsSimd128();
    }
    else
    {
        AssertMsg(lifetime->start <= instr->GetNumber(), "Lifetime start not set correctly");

        ExtendLifetime(lifetime, instr);

        if (lifetime->region != this->curRegion && !this->func->DoOptimizeTry())
        {
            lifetime->dontAllocate = true;
        }
    }
    lifetime->AddToUseCount(LinearScan::GetUseSpillCost(this->loopNest, (this->lastOpHelperLabel != nullptr)), this->curLoop, this->func);
    lifetime->intUsageBv.Set(TySize[regDef->GetType()]);
}